

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1parse.c
# Opt level: O1

int mbedtls_asn1_get_bitstring_null(uchar **p,uchar *end,size_t *len)

{
  uchar *puVar1;
  int iVar2;
  
  puVar1 = *p;
  if (end == puVar1 || (long)end - (long)puVar1 < 0) {
    iVar2 = -0x60;
  }
  else {
    iVar2 = -0x62;
    if (*puVar1 == '\x03') {
      *p = puVar1 + 1;
      iVar2 = mbedtls_asn1_get_len(p,end,len);
    }
  }
  if (iVar2 == 0) {
    iVar2 = -0x68;
    if (*len != 0) {
      *len = *len - 1;
      if (**p == '\0') {
        *p = *p + 1;
        iVar2 = 0;
      }
    }
  }
  return iVar2;
}

Assistant:

int mbedtls_asn1_get_bitstring_null(unsigned char **p, const unsigned char *end,
                                    size_t *len)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    if ((ret = mbedtls_asn1_get_tag(p, end, len, MBEDTLS_ASN1_BIT_STRING)) != 0) {
        return ret;
    }

    if (*len == 0) {
        return MBEDTLS_ERR_ASN1_INVALID_DATA;
    }
    --(*len);

    if (**p != 0) {
        return MBEDTLS_ERR_ASN1_INVALID_DATA;
    }
    ++(*p);

    return 0;
}